

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Trivia __thiscall
slang::parsing::Preprocessor::handleUnconnectedDriveDirective(Preprocessor *this,Token directive)

{
  BumpAllocator *alloc;
  SourceLocation SVar1;
  UnconnectedDriveDirectiveSyntax *syntax;
  Token TVar2;
  Token local_58;
  Token directive_local;
  Token local_38;
  Trivia local_28;
  
  directive_local.info = directive.info;
  directive_local._0_8_ = directive._0_8_;
  checkOutsideDesignElement(this,directive);
  Token::Token(&local_58);
  TVar2 = peek(this);
  if ((ushort)(TVar2.kind - Pull0Keyword) < 2) {
    local_58 = consume(this);
    this->unconnectedDrive = local_58.kind;
  }
  else {
  }
  if (local_58.info == (Info *)0x0) {
    local_38 = peek(this);
    SVar1 = Token::location(&local_38);
    addDiag(this,(DiagCode)0x30004,SVar1);
    alloc = this->alloc;
    local_38 = peek(this);
    SVar1 = Token::location(&local_38);
    local_58 = Token::createMissing(alloc,Pull0Keyword,SVar1);
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::UnconnectedDriveDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&directive_local,&local_58);
  Trivia::Trivia(&local_28,Directive,(SyntaxNode *)syntax);
  return local_28;
}

Assistant:

Trivia Preprocessor::handleUnconnectedDriveDirective(Token directive) {
    checkOutsideDesignElement(directive);

    Token strength;
    switch (peek().kind) {
        case TokenKind::Pull0Keyword:
        case TokenKind::Pull1Keyword:
            strength = consume();
            unconnectedDrive = strength.kind;
            break;
        default:
            break;
    }

    if (!strength) {
        addDiag(diag::ExpectedDriveStrength, peek().location());
        strength = Token::createMissing(alloc, TokenKind::Pull0Keyword, peek().location());
    }

    auto result = alloc.emplace<UnconnectedDriveDirectiveSyntax>(directive, strength);
    return Trivia(TriviaKind::Directive, result);
}